

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_new_bool(qpdf_data qpdf,QPDF_BOOL value)

{
  qpdf_data qpdf_00;
  qpdf_oh qVar1;
  QPDFObjectHandle local_28;
  int local_14;
  qpdf_data p_Stack_10;
  QPDF_BOOL value_local;
  qpdf_data qpdf_local;
  
  local_14 = value;
  p_Stack_10 = qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_oh_new_bool",0);
  qpdf_00 = p_Stack_10;
  QPDFObjectHandle::newBool(&local_28,local_14 != 0);
  qVar1 = new_object(qpdf_00,&local_28);
  QPDFObjectHandle::~QPDFObjectHandle(&local_28);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_bool(qpdf_data qpdf, QPDF_BOOL value)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_bool");
    return new_object(qpdf, QPDFObjectHandle::newBool(value));
}